

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O2

AlignedSentencePair * __thiscall
jhu::thrax::readAlignedSentencePair<false,true>
          (AlignedSentencePair *__return_storage_ptr__,thrax *this,string_view line)

{
  char *pcVar1;
  string_view line_00;
  string_view sv;
  Sentence sentence;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> fs;
  _Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> _Stack_88;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_70;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_58;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> local_40;
  
  pcVar1 = line._M_str;
  fields(&local_40,this,line);
  line_00._M_str = pcVar1;
  line_00._M_len = (size_t)local_40._M_elems[0]._M_str;
  split((Sentence *)&local_58,(thrax *)local_40._M_elems[0]._M_len,line_00);
  tokens<true>((Sentence *)&local_70,local_40._M_elems[1]);
  sv._M_str = pcVar1;
  sv._M_len = (size_t)local_40._M_elems[2]._M_str;
  readAlignment((Alignment *)&_Stack_88,(thrax *)local_40._M_elems[2]._M_len,sv);
  AlignedSentencePair::AlignedSentencePair
            (__return_storage_ptr__,(Sentence *)&local_58,(Sentence *)&local_70,
             (Alignment *)&_Stack_88);
  std::_Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~_Vector_base
            (&_Stack_88);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_70);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

AlignedSentencePair readAlignedSentencePair(std::string_view line) {
  auto fs = fields(line);
  static_assert(std::tuple_size<decltype(fs)>::value == 3);
  return {
    tokens<SourceIsParsed>(fs[0]),
    tokens<TargetIsParsed>(fs[1]),
    readAlignment(fs[2])
  };
}